

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

bool __thiscall
AddrManImpl::Good_(AddrManImpl *this,CService *addr,bool test_before_evict,NodeSeconds time)

{
  bool bVar1;
  int bucket;
  uint32_t uVar2;
  AddrInfo *this_00;
  iterator iVar3;
  Logger *pLVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  uint32_t mapped_as;
  undefined4 uStack_8c;
  int tried_bucket_pos;
  int tried_bucket;
  nid_type nId;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_last_good).__d.__r = (rep)time.__d.__r;
  this_00 = Find(this,addr,&nId);
  if (this_00 != (AddrInfo *)0x0) {
    (this_00->m_last_success).__d.__r = (rep)time.__d.__r;
    (this_00->m_last_try).__d.__r = (rep)time.__d.__r;
    this_00->nAttempts = 0;
    if ((this_00->fInTried == false) && (0 < this_00->nRefCount)) {
      bucket = AddrInfo::GetTriedBucket(this_00,&this->nKey,this->m_netgroupman);
      tried_bucket = bucket;
      tried_bucket_pos = AddrInfo::GetBucketPosition(this_00,&this->nKey,false,bucket);
      if ((!test_before_evict) ||
         (uVar5 = (ulong)(uint)tried_bucket_pos,
         *(long *)((long)this->vvTried[0] + uVar5 * 8 + (ulong)(uint)(bucket << 9)) == -1)) {
        MakeTried(this,this_00,nId);
        uVar2 = NetGroupManager::GetMappedAS(this->m_netgroupman,&addr->super_CNetAddr);
        _mapped_as = CONCAT44(uStack_8c,uVar2);
        pLVar4 = LogInstance();
        bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar4,ADDRMAN,Debug);
        if (bVar1) {
          CService::ToStringAddrPort_abi_cxx11_(&local_58,addr);
          if (uVar2 == 0) {
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
          }
          else {
            tinyformat::format<unsigned_int>(&local_78," mapped to AS%i",&mapped_as);
          }
          logging_function._M_str = "Good_";
          logging_function._M_len = 5;
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
          ;
          source_file._M_len = 0x5b;
          LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,int,int>
                    (logging_function,source_file,0x2a4,ADDRMAN,Debug,
                     (ConstevalFormatString<4U>)0x814cfb,&local_58,&local_78,&tried_bucket,
                     &tried_bucket_pos);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
        }
        bVar1 = true;
        goto LAB_0043a11c;
      }
      if ((this->m_tried_collisions)._M_t._M_impl.super__Rb_tree_header._M_node_count < 10) {
        std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
        _M_insert_unique<long_const&>
                  ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                   &this->m_tried_collisions,&nId);
      }
      iVar3 = std::
              _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->mapInfo)._M_h,
                     (key_type_conflict *)
                     ((long)this->vvTried[0] + uVar5 * 8 + (ulong)(uint)(bucket << 9)));
      pLVar4 = LogInstance();
      bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar4,ADDRMAN,Debug);
      if (bVar1) {
        if (iVar3.super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>._M_cur ==
            (__node_type *)0x0) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
        }
        else {
          CService::ToStringAddrPort_abi_cxx11_
                    (&local_58,
                     (CService *)
                     ((long)iVar3.super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>.
                            _M_cur + 0x10));
        }
        CService::ToStringAddrPort_abi_cxx11_(&local_78,addr);
        _mapped_as = (this->m_tried_collisions)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        logging_function_00._M_str = "Good_";
        logging_function_00._M_len = 5;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
        ;
        source_file_00._M_len = 0x5b;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,unsigned_long>
                  (logging_function_00,source_file_00,0x29d,ADDRMAN,Debug,
                   (ConstevalFormatString<3U>)0x814cae,&local_58,&local_78,
                   (unsigned_long *)&mapped_as);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  bVar1 = false;
LAB_0043a11c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool AddrManImpl::Good_(const CService& addr, bool test_before_evict, NodeSeconds time)
{
    AssertLockHeld(cs);

    nid_type nId;

    m_last_good = time;

    AddrInfo* pinfo = Find(addr, &nId);

    // if not found, bail out
    if (!pinfo) return false;

    AddrInfo& info = *pinfo;

    // update info
    info.m_last_success = time;
    info.m_last_try = time;
    info.nAttempts = 0;
    // nTime is not updated here, to avoid leaking information about
    // currently-connected peers.

    // if it is already in the tried set, don't do anything else
    if (info.fInTried) return false;

    // if it is not in new, something bad happened
    if (!Assume(info.nRefCount > 0)) return false;


    // which tried bucket to move the entry to
    int tried_bucket = info.GetTriedBucket(nKey, m_netgroupman);
    int tried_bucket_pos = info.GetBucketPosition(nKey, false, tried_bucket);

    // Will moving this address into tried evict another entry?
    if (test_before_evict && (vvTried[tried_bucket][tried_bucket_pos] != -1)) {
        if (m_tried_collisions.size() < ADDRMAN_SET_TRIED_COLLISION_SIZE) {
            m_tried_collisions.insert(nId);
        }
        // Output the entry we'd be colliding with, for debugging purposes
        auto colliding_entry = mapInfo.find(vvTried[tried_bucket][tried_bucket_pos]);
        LogDebug(BCLog::ADDRMAN, "Collision with %s while attempting to move %s to tried table. Collisions=%d\n",
                 colliding_entry != mapInfo.end() ? colliding_entry->second.ToStringAddrPort() : "",
                 addr.ToStringAddrPort(),
                 m_tried_collisions.size());
        return false;
    } else {
        // move nId to the tried tables
        MakeTried(info, nId);
        const auto mapped_as{m_netgroupman.GetMappedAS(addr)};
        LogDebug(BCLog::ADDRMAN, "Moved %s%s to tried[%i][%i]\n",
                 addr.ToStringAddrPort(), (mapped_as ? strprintf(" mapped to AS%i", mapped_as) : ""), tried_bucket, tried_bucket_pos);
        return true;
    }
}